

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_>::read_to
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ser_context *context;
  
  if ((this->cursor_visitor_).data_.type_ != 0) {
    basic_staj_visitor<char>::dump
              (&this->cursor_visitor_,visitor,
               (ser_context *)
               ((long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor +
               (long)(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3]),ec);
    return;
  }
  iVar2 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(this);
  if ((~*(byte *)CONCAT44(extraout_var,iVar2) & 0xc) != 0) {
    basic_staj_event<char>::send_json_event
              (&(this->cursor_visitor_).event_,visitor,
               (ser_context *)
               ((long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor +
               (long)(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3]),ec);
    return;
  }
  (this->parser_).cursor_mode_ = false;
  pp_Var1 = (this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor;
  (this->parser_).mark_level_ =
       (int)((ulong)((long)(this->parser_).state_stack_.
                           super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->parser_).state_stack_.
                          super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  basic_staj_event<char>::send_json_event
            (&(this->cursor_visitor_).event_,visitor,
             (ser_context *)
             ((long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor +
             (long)pp_Var1[-3]),ec);
  if (ec->_M_value != 0) {
    return;
  }
  read_next(this,visitor,ec);
  (this->parser_).cursor_mode_ = true;
  (this->parser_).mark_level_ = 0;
  iVar2 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(this);
  context = (ser_context *)
            ((long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor +
            (long)(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3]);
  if (*(char *)CONCAT44(extraout_var_00,iVar2) == '\r') {
    basic_json_visitor<char>::end_object
              (&(this->cursor_visitor_).super_basic_json_visitor<char>,context);
    return;
  }
  basic_json_visitor<char>::end_array
            (&(this->cursor_visitor_).super_basic_json_visitor<char>,context);
  return;
}

Assistant:

void read_to(basic_json_visitor<char_type>& visitor,
        std::error_code& ec) override
    {
        if (is_typed_array())
        {
            cursor_visitor_.dump(visitor, *this, ec);
        }
        else if (is_begin_container(current().event_type()))
        {
            parser_.cursor_mode(false);
            parser_.mark_level(parser_.level());
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            read_next(visitor, ec);
            parser_.cursor_mode(true);
            parser_.mark_level(0);
            if (current().event_type() == staj_event_type::begin_object)
            {
                cursor_visitor_.end_object(*this);
            }
            else
            {
                cursor_visitor_.end_array(*this);
            }
        }
        else
        {
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
        }
    }